

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O1

bool MyGame::Example::VerifyAnyUniqueAliases(Verifier *verifier,void *obj,AnyUniqueAliases type)

{
  bool bVar1;
  undefined3 in_register_00000011;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000011,type);
  bVar1 = true;
  if (iVar2 == 3) {
    if (obj != (void *)0x0) {
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)obj);
      if (bVar1) {
        verifier->depth_ = verifier->depth_ - 1;
      }
    }
  }
  else if (iVar2 == 2) {
    if (obj != (void *)0x0) {
      bVar1 = TestSimpleTableWithEnum::Verify((TestSimpleTableWithEnum *)obj,verifier);
      return bVar1;
    }
  }
  else if ((iVar2 == 1) && (obj != (void *)0x0)) {
    bVar1 = Monster::Verify((Monster *)obj,verifier);
    return bVar1;
  }
  return bVar1;
}

Assistant:

inline bool VerifyAnyUniqueAliases(::flatbuffers::Verifier &verifier, const void *obj, AnyUniqueAliases type) {
  switch (type) {
    case AnyUniqueAliases_NONE: {
      return true;
    }
    case AnyUniqueAliases_M: {
      auto ptr = reinterpret_cast<const MyGame::Example::Monster *>(obj);
      return verifier.VerifyTable(ptr);
    }
    case AnyUniqueAliases_TS: {
      auto ptr = reinterpret_cast<const MyGame::Example::TestSimpleTableWithEnum *>(obj);
      return verifier.VerifyTable(ptr);
    }
    case AnyUniqueAliases_M2: {
      auto ptr = reinterpret_cast<const MyGame::Example2::Monster *>(obj);
      return verifier.VerifyTable(ptr);
    }
    default: return true;
  }
}